

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void iidentity16_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar1 = _DAT_00564250;
  lVar2 = 0;
  do {
    auVar3 = *(undefined1 (*) [16])((long)*input + lVar2);
    auVar4 = pmulhrsw(auVar3,auVar1);
    auVar3 = paddsw(auVar3,auVar3);
    auVar3 = paddsw(auVar3,auVar4);
    *(undefined1 (*) [16])((long)*output + lVar2) = auVar3;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

static void iidentity16_ssse3(const __m128i *input, __m128i *output) {
  const int16_t scale_fractional = 2 * (NewSqrt2 - (1 << NewSqrt2Bits));
  const __m128i scale = _mm_set1_epi16(scale_fractional << (15 - NewSqrt2Bits));
  for (int i = 0; i < 16; ++i) {
    __m128i x = _mm_mulhrs_epi16(input[i], scale);
    __m128i srcx2 = _mm_adds_epi16(input[i], input[i]);
    output[i] = _mm_adds_epi16(x, srcx2);
  }
}